

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhaplanner.cpp
# Opt level: O0

bool __thiscall MHAPlanner::time_limit_reached(MHAPlanner *this)

{
  MHAPlanner *this_local;
  bool local_1;
  
  if (((this->m_params).return_first_solution & 1U) == 0) {
    if (((this->m_params).max_time <= 0.0) || (this->m_elapsed < (this->m_params).max_time)) {
      if ((this->m_max_expansions < 1) || (this->m_num_expansions < this->m_max_expansions)) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MHAPlanner::time_limit_reached() const
{
    if (m_params.return_first_solution) {
        return false;
    }
    else if (m_params.max_time > 0.0 && m_elapsed >= m_params.max_time) {
        return true;
    }
    else if (m_max_expansions > 0 && m_num_expansions >= m_max_expansions) {
        return true;
    }
    else {
        return false;
    }
}